

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

int64_t GetBlockProofEquivalentTime
                  (CBlockIndex *to,CBlockIndex *from,CBlockIndex *tip,Params *params)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint64_t uVar5;
  base_uint<256U> *in_RCX;
  long in_FS_OFFSET;
  int sign;
  arith_uint256 r;
  base_uint<256U> *in_stack_fffffffffffffe68;
  base_uint<256U> *in_stack_fffffffffffffe70;
  CBlockIndex *in_stack_fffffffffffffe78;
  base_uint<256U> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int iVar6;
  undefined8 local_150;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffffe68);
  iVar6 = 1;
  bVar2 = operator>((base_uint<256U> *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  if (bVar2) {
    operator-(in_RCX,(base_uint<256U> *)CONCAT44(iVar6,in_stack_fffffffffffffe88));
    arith_uint256::arith_uint256
              ((arith_uint256 *)in_stack_fffffffffffffe68,(base_uint<256U> *)0xf2ae86);
    arith_uint256::operator=
              ((arith_uint256 *)in_stack_fffffffffffffe78,(arith_uint256 *)in_stack_fffffffffffffe70
              );
  }
  else {
    operator-(in_RCX,(base_uint<256U> *)CONCAT44(iVar6,in_stack_fffffffffffffe88));
    arith_uint256::arith_uint256
              ((arith_uint256 *)in_stack_fffffffffffffe68,(base_uint<256U> *)0xf2aed1);
    arith_uint256::operator=
              ((arith_uint256 *)in_stack_fffffffffffffe78,(arith_uint256 *)in_stack_fffffffffffffe70
              );
    iVar6 = -1;
  }
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffffe68,0xf2af04);
  operator*(in_RCX,(base_uint<256U> *)CONCAT44(iVar6,in_stack_fffffffffffffe88));
  GetBlockProof(in_stack_fffffffffffffe78);
  operator/(in_RCX,(base_uint<256U> *)CONCAT44(iVar6,in_stack_fffffffffffffe88));
  arith_uint256::arith_uint256
            ((arith_uint256 *)in_stack_fffffffffffffe68,(base_uint<256U> *)0xf2af5c);
  arith_uint256::operator=
            ((arith_uint256 *)in_stack_fffffffffffffe78,(arith_uint256 *)in_stack_fffffffffffffe70);
  uVar3 = base_uint<256U>::bits(in_stack_fffffffffffffe80);
  if (uVar3 < 0x40) {
    local_150 = (long)iVar6;
    uVar5 = base_uint<256U>::GetLow64(in_stack_fffffffffffffe68);
    local_150 = local_150 * uVar5;
  }
  else {
    local_150 = (long)iVar6;
    lVar4 = std::numeric_limits<long>::max();
    local_150 = local_150 * lVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_150;
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetBlockProofEquivalentTime(const CBlockIndex& to, const CBlockIndex& from, const CBlockIndex& tip, const Consensus::Params& params)
{
    arith_uint256 r;
    int sign = 1;
    if (to.nChainWork > from.nChainWork) {
        r = to.nChainWork - from.nChainWork;
    } else {
        r = from.nChainWork - to.nChainWork;
        sign = -1;
    }
    r = r * arith_uint256(params.nPowTargetSpacing) / GetBlockProof(tip);
    if (r.bits() > 63) {
        return sign * std::numeric_limits<int64_t>::max();
    }
    return sign * int64_t(r.GetLow64());
}